

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::MergePartialFromCodedStream
          (TreeEnsembleParameters_TreeNode *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  uint8 uVar3;
  byte *pbVar4;
  double *pdVar5;
  bool bVar6;
  uint32 uVar7;
  uint8 *puVar8;
  pair<int,_int> pVar9;
  RepeatedPtrFieldBase *this_00;
  char cVar10;
  uint uVar11;
  int byte_limit;
  ulong uVar12;
  int iVar13;
  pair<unsigned_long,_bool> pVar14;
  double local_50;
  RepeatedPtrFieldBase *local_48;
  int local_3c;
  Type *local_38;
  
  this_00 = &(this->evaluationinfo_).super_RepeatedPtrFieldBase;
  do {
    pbVar4 = input->buffer_;
    uVar7 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar12 = (ulong)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar11 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar11, (~(uint)*pbVar1 & uVar11) < 0x80))
        goto LAB_003cc133;
        uVar12 = (ulong)((uVar11 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar12 = uVar12 | 0x100000000;
    }
    else {
LAB_003cc133:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    uVar7 = (uint32)uVar12;
    iVar13 = 6;
    if ((uVar12 & 0x100000000) == 0) goto switchD_003cbe73_caseD_4;
    uVar11 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar12;
    switch(uVar11) {
    case 1:
      if (cVar10 != '\b') break;
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (-1 < (long)(char)*puVar8)) {
        this->treeid_ = (long)(char)*puVar8;
        goto LAB_003cc04a;
      }
      pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      this->treeid_ = pVar14.first;
LAB_003cc104:
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_003cbeaf;
      goto LAB_003cbead;
    case 2:
      if (cVar10 == '\x10') {
        puVar8 = input->buffer_;
        if ((input->buffer_end_ <= puVar8) || ((long)(char)*puVar8 < 0)) {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->nodeid_ = pVar14.first;
          goto LAB_003cc104;
        }
        this->nodeid_ = (long)(char)*puVar8;
LAB_003cc04a:
        input->buffer_ = puVar8 + 1;
        goto LAB_003cbead;
      }
      break;
    case 3:
      if (cVar10 != '\x18') break;
      pbVar4 = input->buffer_;
      if (pbVar4 < input->buffer_end_) {
        bVar2 = *pbVar4;
        uVar12 = (ulong)bVar2;
        uVar7 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_003cc1a7;
        input->buffer_ = pbVar4 + 1;
        bVar6 = true;
      }
      else {
        uVar7 = 0;
LAB_003cc1a7:
        uVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        bVar6 = -1 < (long)uVar12;
      }
      if (bVar6) {
        local_3c = (int)uVar12;
        this->nodebehavior_ = local_3c;
        goto LAB_003cbead;
      }
      goto LAB_003cbeaf;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
      break;
    case 10:
      if (cVar10 == 'P') {
        puVar8 = input->buffer_;
        if ((input->buffer_end_ <= puVar8) || ((long)(char)*puVar8 < 0)) {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->branchfeatureindex_ = pVar14.first;
          goto LAB_003cc104;
        }
        this->branchfeatureindex_ = (long)(char)*puVar8;
        goto LAB_003cc04a;
      }
      break;
    case 0xb:
      if (cVar10 == 'Y') {
        pdVar5 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                            (input,(uint64 *)&local_50);
          if (!bVar6) goto LAB_003cbeaf;
        }
        else {
          local_50 = *pdVar5;
          input->buffer_ = (uint8 *)(pdVar5 + 1);
        }
        this->branchfeaturevalue_ = local_50;
        goto LAB_003cbead;
      }
      break;
    case 0xc:
      if (cVar10 == '`') {
        puVar8 = input->buffer_;
        if ((input->buffer_end_ <= puVar8) || ((long)(char)*puVar8 < 0)) {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->truechildnodeid_ = pVar14.first;
          goto LAB_003cc104;
        }
        this->truechildnodeid_ = (long)(char)*puVar8;
        goto LAB_003cc04a;
      }
      break;
    case 0xd:
      if (cVar10 == 'h') {
        puVar8 = input->buffer_;
        if ((input->buffer_end_ <= puVar8) || ((long)(char)*puVar8 < 0)) {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->falsechildnodeid_ = pVar14.first;
          goto LAB_003cc104;
        }
        this->falsechildnodeid_ = (long)(char)*puVar8;
        goto LAB_003cc04a;
      }
      break;
    case 0xe:
      if (cVar10 == 'p') {
        puVar8 = input->buffer_;
        if ((puVar8 < input->buffer_end_) && (uVar3 = *puVar8, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar8 + 1;
          pVar14._8_8_ = 1;
          pVar14.first = (long)(char)uVar3;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->missingvaluetrackstruechild_ = pVar14.first != 0;
          goto LAB_003cbead;
        }
        goto LAB_003cbeaf;
      }
      break;
    case 0x14:
      if (cVar10 == -0x5e) {
        local_38 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
                             (this_00,(Type *)0x0);
        puVar8 = input->buffer_;
        if ((puVar8 < input->buffer_end_) && (byte_limit = (int)(char)*puVar8, -1 < (char)*puVar8))
        {
          input->buffer_ = puVar8 + 1;
          bVar6 = true;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar6 = -1 < byte_limit;
        }
        if ((((!bVar6) ||
             (local_48 = this_00,
             pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,byte_limit), this_00 = local_48, (long)pVar9 < 0)) ||
            (bVar6 = TreeEnsembleParameters_TreeNode_EvaluationInfo::MergePartialFromCodedStream
                               (local_38,input), this_00 = local_48, !bVar6)) ||
           (bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar9.first), this_00 = local_48, !bVar6)) goto LAB_003cbeaf;
        goto LAB_003cbead;
      }
      break;
    default:
      if ((uVar11 == 0x1e) && (cVar10 == -0xf)) {
        pdVar5 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar5 < 8) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                            (input,(uint64 *)&local_50);
          if (!bVar6) goto LAB_003cbeaf;
        }
        else {
          local_50 = *pdVar5;
          input->buffer_ = (uint8 *)(pdVar5 + 1);
        }
        this->relativehitrate_ = local_50;
        goto LAB_003cbead;
      }
    }
switchD_003cbe73_caseD_4:
    if ((uVar7 & 7) == 4 || uVar7 == 0) {
      iVar13 = 7;
    }
    else {
      bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
      if (bVar6) {
LAB_003cbead:
        iVar13 = 0;
      }
    }
LAB_003cbeaf:
    if (iVar13 != 0) {
      return iVar13 != 6;
    }
  } while( true );
}

Assistant:

bool TreeEnsembleParameters_TreeNode::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 treeId = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &treeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 nodeId = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &nodeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_nodebehavior(static_cast< ::CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 branchFeatureIndex = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &branchfeatureindex_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double branchFeatureValue = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(89u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &branchfeaturevalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 trueChildNodeId = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &truechildnodeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 falseChildNodeId = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(104u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &falsechildnodeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool missingValueTracksTrueChild = 14;
      case 14: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(112u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &missingvaluetrackstruechild_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_evaluationinfo()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double relativeHitRate = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(241u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &relativehitrate_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  return false;
#undef DO_
}